

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O2

bool __thiscall spvtools::opt::VectorDCE::HasVectorResult(VectorDCE *this,Instruction *inst)

{
  uint32_t uVar1;
  TypeManager *this_00;
  Type *pTVar2;
  bool bVar3;
  
  this_00 = IRContext::get_type_mgr((this->super_MemPass).super_Pass.context_);
  uVar1 = Instruction::type_id(inst);
  if (uVar1 == 0) {
    bVar3 = false;
  }
  else {
    uVar1 = Instruction::type_id(inst);
    pTVar2 = analysis::TypeManager::GetType(this_00,uVar1);
    bVar3 = pTVar2->kind_ == kVector;
  }
  return bVar3;
}

Assistant:

bool VectorDCE::HasVectorResult(const Instruction* inst) const {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  if (inst->type_id() == 0) {
    return false;
  }

  const analysis::Type* current_type = type_mgr->GetType(inst->type_id());
  switch (current_type->kind()) {
    case analysis::Type::kVector:
      return true;
    default:
      return false;
  }
}